

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O1

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  stsentry *e;
  char *__s;
  int iVar1;
  time_t tVar2;
  size_t sVar3;
  long lVar4;
  Curl_llist_element *pCVar5;
  stsentry *psVar6;
  byte bVar7;
  bool bVar8;
  char buffer [257];
  undefined8 local_140;
  char local_138 [264];
  
  if (h != (hsts *)0x0) {
    bVar8 = false;
    tVar2 = time((time_t *)0x0);
    sVar3 = strlen(hostname);
    psVar6 = (stsentry *)0x0;
    if (sVar3 - 1 < 0x100) {
      memcpy(local_138,hostname,sVar3);
      local_140 = sVar3 - 1;
      if (hostname[sVar3 - 1] != '.') {
        local_140 = sVar3;
      }
      local_138[local_140] = '\0';
      pCVar5 = (h->list).head;
      if (pCVar5 == (Curl_llist_element *)0x0) {
        bVar8 = true;
      }
      else {
        do {
          e = (stsentry *)pCVar5->ptr;
          pCVar5 = pCVar5->next;
          if (tVar2 < e->expires) {
            if ((subdomain) && (e->includeSubDomains == true)) {
              __s = e->host;
              sVar3 = strlen(__s);
              bVar8 = true;
              lVar4 = local_140 - sVar3;
              if ((sVar3 <= local_140 && lVar4 != 0) &&
                 ((local_138[lVar4 + -1] == '.' &&
                  (iVar1 = curl_strnequal(local_138 + lVar4,__s,sVar3), iVar1 != 0)))) {
                bVar8 = false;
                psVar6 = e;
              }
              bVar7 = 1;
              if (!bVar8) goto LAB_0067c51d;
            }
            iVar1 = curl_strequal(local_138,e->host);
            bVar7 = iVar1 != 0;
            if ((bool)bVar7) {
              psVar6 = e;
            }
          }
          else {
            Curl_llist_remove(&h->list,(Curl_llist_element *)e,(void *)0x0);
            (*Curl_cfree)(e->host);
            (*Curl_cfree)(e);
            bVar7 = 4;
          }
LAB_0067c51d:
          if ((bVar7 & 3) != 0) goto LAB_0067c52d;
        } while (pCVar5 != (Curl_llist_element *)0x0);
        bVar7 = 0;
LAB_0067c52d:
        bVar8 = bVar7 == 0;
      }
    }
    if (!bVar8) {
      return psVar6;
    }
  }
  return (stsentry *)0x0;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  if(h) {
    char buffer[MAX_HSTS_HOSTLEN + 1];
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_element *e;
    struct Curl_llist_element *n;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    memcpy(buffer, hostname, hlen);
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;
    buffer[hlen] = 0;
    hostname = buffer;

    for(e = h->list.head; e; e = n) {
      struct stsentry *sts = e->ptr;
      n = e->next;
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_llist_remove(&h->list, &sts->node, NULL);
        hsts_free(sts);
        continue;
      }
      if(subdomain && sts->includeSubDomains) {
        size_t ntail = strlen(sts->host);
        if(ntail < hlen) {
          size_t offs = hlen - ntail;
          if((hostname[offs-1] == '.') &&
             strncasecompare(&hostname[offs], sts->host, ntail))
            return sts;
        }
      }
      if(strcasecompare(hostname, sts->host))
        return sts;
    }
  }
  return NULL; /* no match */
}